

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph_manager.cpp
# Opt level: O3

JoinCondition *
duckdb::MaybeInvertConditions
          (JoinCondition *__return_storage_ptr__,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *condition,
          bool invert)

{
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  ExpressionType EVar3;
  pointer pEVar4;
  BoundComparisonExpression *pBVar5;
  JoinCondition *pJVar6;
  undefined7 extraout_var;
  undefined7 in_register_00000011;
  ulong uVar7;
  
  uVar7 = CONCAT71(in_register_00000011,invert) & 0xffffffff;
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (condition);
  pBVar5 = BaseExpression::Cast<duckdb::BoundComparisonExpression>(&pEVar4->super_BaseExpression);
  _Var1.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (&pBVar5->left)[uVar7].
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>;
  (&pBVar5->left)[uVar7].
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> =
       (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  (__return_storage_ptr__->left).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       _Var1.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       *(Expression **)
        &(&pBVar5->left)[!invert].
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>;
  (&pBVar5->left)[!invert].
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> =
       (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  (__return_storage_ptr__->right).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (condition);
  EVar3 = (pEVar4->super_BaseExpression).type;
  pJVar6 = (JoinCondition *)CONCAT71((int7)((ulong)pEVar4 >> 8),EVar3);
  __return_storage_ptr__->comparison = EVar3;
  if ((char)uVar7 != '\0') {
    EVar3 = FlipComparisonExpression(EVar3);
    pJVar6 = (JoinCondition *)CONCAT71(extraout_var,EVar3);
    __return_storage_ptr__->comparison = EVar3;
  }
  return pJVar6;
}

Assistant:

static JoinCondition MaybeInvertConditions(unique_ptr<Expression> condition, bool invert) {
	auto &comparison = condition->Cast<BoundComparisonExpression>();
	JoinCondition cond;
	cond.left = !invert ? std::move(comparison.left) : std::move(comparison.right);
	cond.right = !invert ? std::move(comparison.right) : std::move(comparison.left);
	cond.comparison = condition->GetExpressionType();
	if (invert) {
		// reverse comparison expression if we reverse the order of the children
		cond.comparison = FlipComparisonExpression(cond.comparison);
	}
	return cond;
}